

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::checkTypeFromAnotherSchema
          (TraverseSchema *this,DOMElement *elem,XMLCh *typeStr)

{
  bool bVar1;
  XMLCh *pXVar2;
  
  pXVar2 = getPrefix(this,typeStr);
  pXVar2 = resolvePrefixToURI(this,elem,pXVar2);
  bVar1 = XMLString::equals(pXVar2,this->fTargetNSURIString);
  if ((!bVar1) &&
     (bVar1 = XMLString::equals(pXVar2,(XMLCh *)SchemaSymbols::fgURI_SCHEMAFORSCHEMA), !bVar1)) {
    return pXVar2;
  }
  return (XMLCh *)0x0;
}

Assistant:

const XMLCh*
TraverseSchema::checkTypeFromAnotherSchema(const DOMElement* const elem,
                                           const XMLCh* const typeStr) {

    const XMLCh* prefix = getPrefix(typeStr);
    const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);

    if (!XMLString::equals(typeURI, fTargetNSURIString)
        && !XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)
        ) {
        return typeURI;
    }

    return 0;
}